

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status __thiscall
google::protobuf::(anonymous_namespace)::
Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
          (_anonymous_namespace_ *this,char *args,Edition args_1,char *args_2,Edition args_3)

{
  AlphaNum *in_R9;
  string_view message;
  string local_178;
  AlphaNum local_158;
  AlphaNum local_128;
  string local_e8;
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  undefined1 local_40 [16];
  Edition local_2c;
  char *pcStack_28;
  Edition args_local_3;
  char *args_local_2;
  char *pcStack_18;
  Edition args_local_1;
  char *args_local;
  
  local_2c = args_3;
  pcStack_28 = args_2;
  args_local_2._4_4_ = args_1;
  pcStack_18 = args;
  args_local = (char *)this;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_90,args);
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8.field_2._8_8_ = 0;
  local_e8._M_dataplus = (_Alloc_hider)0x0;
  local_e8._1_7_ = 0;
  local_e8._M_string_length = 0;
  absl::lts_20250127::strings_internal::StringifySink::StringifySink((StringifySink *)&local_e8);
  absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::Edition,void>
            (&local_c0,(Edition *)((long)&args_local_2 + 4),(StringifySink *)&local_e8);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_128,pcStack_28);
  local_178.field_2._M_allocated_capacity = 0;
  local_178.field_2._8_8_ = 0;
  local_178._M_dataplus = (_Alloc_hider)0x0;
  local_178._1_7_ = 0;
  local_178._M_string_length = 0;
  absl::lts_20250127::strings_internal::StringifySink::StringifySink((StringifySink *)&local_178);
  absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::Edition,void>
            (&local_158,&local_2c,(StringifySink *)&local_178);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_60,(lts_20250127 *)&local_90,&local_c0,&local_128,&local_158,in_R9);
  local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
  message._M_str = local_40._0_8_;
  message._M_len = (size_t)this;
  absl::lts_20250127::FailedPreconditionError(message);
  std::__cxx11::string::~string((string *)&local_60);
  absl::lts_20250127::strings_internal::StringifySink::~StringifySink((StringifySink *)&local_178);
  absl::lts_20250127::strings_internal::StringifySink::~StringifySink((StringifySink *)&local_e8);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}